

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Vector4f __thiscall Matrix4f::getCol(Matrix4f *this,int j)

{
  float fy;
  long lVar1;
  int iVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  undefined8 extraout_XMM0_Qa;
  ulong uVar3;
  Vector4f VVar4;
  int colStart;
  int j_local;
  Matrix4f *this_local;
  
  lVar1 = CONCAT44(in_register_00000034,j);
  iVar2 = in_EDX * 4;
  fy = *(float *)(lVar1 + (long)(iVar2 + 1) * 4);
  uVar3 = (ulong)(uint)fy;
  Vector4f::Vector4f((Vector4f *)this,*(float *)(lVar1 + (long)iVar2 * 4),fy,
                     *(float *)(lVar1 + (long)(iVar2 + 2) * 4),
                     *(float *)(lVar1 + (long)(iVar2 + 3) * 4));
  VVar4.m_elements[2] = (float)(int)uVar3;
  VVar4.m_elements[3] = (float)(int)(uVar3 >> 0x20);
  VVar4.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  VVar4.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector4f)VVar4.m_elements;
}

Assistant:

Vector4f Matrix4f::getCol( int j ) const
{
	int colStart = 4 * j;

	return Vector4f
	(
		m_elements[ colStart ],
		m_elements[ colStart + 1 ],
		m_elements[ colStart + 2 ],
		m_elements[ colStart + 3 ]
	);
}